

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

void __thiscall HashTbl::HashTbl(HashTbl *this,uint cidHash)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  
  NoReleaseAllocator::NoReleaseAllocator(&this->m_noReleaseAllocator,0x100,0x4000);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.h"
                       ,0x13b,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this->m_prgpidName = (Ident **)0x0;
  memset(this->m_rpid,0,0x450);
  BVar3 = Init(this,cidHash);
  if (BVar3 != 0) {
    return;
  }
  Js::Throw::OutOfMemory();
}

Assistant:

HashTbl(uint cidHash = DEFAULT_HASH_TABLE_SIZE)
    {
        AssertCanHandleOutOfMemory();
        m_prgpidName = nullptr;
        memset(&m_rpid, 0, sizeof(m_rpid));
        if (!Init(cidHash))
        {
            Js::Throw::OutOfMemory();
        }
    }